

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O0

Texture * rw::d3d8::readNativeTexture(Stream *stream)

{
  FILE *pFVar1;
  bool bVar2;
  byte bVar3;
  uint16 uVar4;
  uint32 uVar5;
  int32 iVar6;
  uint width_00;
  uint height_00;
  uint depth_00;
  uint numLevels_00;
  uint uVar7;
  char *pcVar8;
  Raster *pRVar9;
  uint8 *puVar10;
  int local_84;
  int32 i;
  uint8 *data;
  long lStack_70;
  uint32 size;
  D3dRaster *ras;
  Raster *raster;
  int32 pallength;
  int32 compression;
  int32 type;
  int32 numLevels;
  int32 depth;
  int32 height;
  int32 width;
  bool32 hasAlpha;
  uint32 format;
  Texture *tex;
  undefined4 local_28;
  Error _e_1;
  Error _e;
  uint32 platform;
  Stream *stream_local;
  
  bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar2) {
    uVar5 = Stream::readU32(stream);
    if (uVar5 == 8) {
      stream_local = (Stream *)Texture::create((Raster *)0x0);
      if ((Texture *)stream_local == (Texture *)0x0) {
        stream_local = (Stream *)0x0;
      }
      else {
        uVar5 = Stream::readU32(stream);
        ((Texture *)stream_local)->filterAddressing = uVar5;
        (*stream->_vptr_Stream[4])(stream,((Texture *)stream_local)->name,0x20);
        (*stream->_vptr_Stream[4])(stream,((Texture *)stream_local)->mask,0x20);
        uVar5 = Stream::readU32(stream);
        iVar6 = Stream::readI32(stream);
        uVar4 = Stream::readU16(stream);
        width_00 = (uint)uVar4;
        uVar4 = Stream::readU16(stream);
        height_00 = (uint)uVar4;
        bVar3 = Stream::readU8(stream);
        depth_00 = (uint)bVar3;
        bVar3 = Stream::readU8(stream);
        numLevels_00 = (uint)bVar3;
        bVar3 = Stream::readU8(stream);
        uVar7 = (uint)bVar3;
        bVar3 = Stream::readU8(stream);
        raster._4_4_ = 0;
        if (((uVar5 & 0x4000) != 0) || ((uVar5 & 0x2000) != 0)) {
          raster._4_4_ = 0x100;
          if ((uVar5 & 0x4000) != 0) {
            raster._4_4_ = 0x20;
          }
          if (d3d::isP8supported == 0) {
            pRVar9 = readAsImage(stream,width_00,height_00,depth_00,uVar5 | uVar7,numLevels_00);
            ((Texture *)stream_local)->raster = pRVar9;
            return (Texture *)stream_local;
          }
        }
        if (bVar3 == 0) {
          ras = (D3dRaster *)Raster::create(width_00,height_00,depth_00,uVar5 | uVar7,8);
          lStack_70 = (long)&((Raster *)ras)->platform + (long)d3d::nativeRasterOffset;
        }
        else {
          ras = (D3dRaster *)Raster::create(width_00,height_00,depth_00,uVar5 | uVar7 | 0x80,8);
          lStack_70 = (long)&((Raster *)ras)->platform + (long)d3d::nativeRasterOffset;
          d3d::allocateDXT((Raster *)ras,(uint)bVar3,numLevels_00,iVar6);
          *(undefined1 *)(lStack_70 + 0x21) = 1;
        }
        ((Texture *)stream_local)->raster = (Raster *)ras;
        if (raster._4_4_ != 0) {
          (*stream->_vptr_Stream[4])
                    (stream,*(undefined8 *)(lStack_70 + 8),(ulong)(uint)(raster._4_4_ << 2));
        }
        for (local_84 = 0; local_84 < (int)numLevels_00; local_84 = local_84 + 1) {
          uVar5 = Stream::readU32(stream);
          iVar6 = Raster::getNumLevels((Raster *)ras);
          if (local_84 < iVar6) {
            puVar10 = Raster::lock((Raster *)ras,local_84,5);
            (*stream->_vptr_Stream[4])(stream,puVar10,(ulong)uVar5);
            Raster::unlock((Raster *)ras,local_84);
          }
          else {
            (*stream->_vptr_Stream[5])(stream,(ulong)uVar5,1);
          }
        }
      }
    }
    else {
      tex._4_4_ = 2;
      local_28 = 0x80000006;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d8.cpp",0x21c
             );
      pFVar1 = _stderr;
      pcVar8 = dbgsprint(0x80000006,(ulong)uVar5);
      fprintf(pFVar1,"%s\n",pcVar8);
      setError((Error *)((long)&tex + 4));
      stream_local = (Stream *)0x0;
    }
  }
  else {
    _e_1.plugin = 2;
    _e_1.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d8.cpp",0x217);
    pFVar1 = _stderr;
    pcVar8 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar1,"%s\n",pcVar8);
    setError(&_e_1);
    stream_local = (Stream *)0x0;
  }
  return (Texture *)stream_local;
}

Assistant:

Texture*
readNativeTexture(Stream *stream)
{
	uint32 platform;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_D3D8){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	Texture *tex = Texture::create(nil);
	if(tex == nil)
		return nil;

	// Texture
	tex->filterAddressing = stream->readU32();
	stream->read8(tex->name, 32);
	stream->read8(tex->mask, 32);

	// Raster
	uint32 format = stream->readU32();
	bool32 hasAlpha = stream->readI32();
	int32 width = stream->readU16();
	int32 height = stream->readU16();
	int32 depth = stream->readU8();
	int32 numLevels = stream->readU8();
	int32 type = stream->readU8();
	int32 compression = stream->readU8();

	int32 pallength = 0;
	if(format & Raster::PAL4 || format & Raster::PAL8){
		pallength = format & Raster::PAL4 ? 32 : 256;
		if(!d3d::isP8supported){
			tex->raster = readAsImage(stream, width, height, depth, format|type, numLevels);
			return tex;
		}
	}

	Raster *raster;
	D3dRaster *ras;
	if(compression){
		raster = Raster::create(width, height, depth, format | type | Raster::DONTALLOCATE, PLATFORM_D3D8);
		ras = GETD3DRASTEREXT(raster);
		allocateDXT(raster, compression, numLevels, hasAlpha);
		ras->customFormat = 1;
	}else{
		raster = Raster::create(width, height, depth, format | type, PLATFORM_D3D8);
		ras = GETD3DRASTEREXT(raster);
	}
	tex->raster = raster;

	// TODO: check if format supported and convert if necessary

	if(pallength != 0)
		stream->read8(ras->palette, 4*pallength);

	uint32 size;
	uint8 *data;
	for(int32 i = 0; i < numLevels; i++){
		size = stream->readU32();
		if(i < raster->getNumLevels()){
			data = raster->lock(i, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
			stream->read8(data, size);
			raster->unlock(i);
		}else
			stream->seek(size);
	}
	return tex;
}